

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monmove.c
# Opt level: O0

int dochug(monst *mtmp)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  monst *pmVar4;
  boolean bVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  char *pcVar9;
  long lVar10;
  obj *poVar11;
  bool bVar12;
  int local_d8;
  char *local_d0;
  char *local_b0;
  attack *local_a8;
  attack *a;
  obj *mw_tmp;
  int dmg;
  boolean m_sen;
  monst *nmon;
  monst *m2;
  long goffer;
  long gdemand;
  undefined1 local_68 [4];
  int res;
  musable musable;
  obj *lepgold;
  obj *ygold;
  int scared;
  int nearby;
  int inrange;
  int tmp;
  permonst *mdat;
  monst *mtmp_local;
  
  nearby = 0;
  lepgold = (obj *)0x0;
  musable.has_misc = MUSE_NONE;
  musable._36_4_ = 0;
  _inrange = mtmp->data;
  mdat = (permonst *)mtmp;
  if (((mtmp->mstrategy & 0x40000000U) != 0) && (iVar7 = m_arrival(mtmp), -1 < iVar7)) {
    return iVar7;
  }
  if ((((ulong)mdat[1].mname & 0x20000000) != 0) &&
     (((((((u.uprops[0xd].intrinsic == 0 && (u.uprops[0xd].extrinsic == 0)) &&
          (youmonst.data != mons + 0x9e)) && (youmonst.data != mons + 0x7b)) ||
        ((u.uprops[0xd].blocked != 0 || ((*(uint *)(*(long *)&mdat->mlet + 0x30) & 0x1000000) != 0))
        )) && (((((byte)u._1052_1_ >> 1 & 1) == 0 &&
                ((((byte)u._1052_1_ >> 5 & 1) == 0 && (((uint)mdat[1].mattk[4] >> 9 & 1) == 0)))) &&
               ((viz_array[(char)mdat[1].mattk[0].aatyp][*(char *)((long)&mdat[1].geno + 1)] & 1U)
                != 0)))) ||
      (iVar7._0_2_ = mdat->pxtyp, iVar7._2_1_ = mdat->msound, iVar7._3_1_ = mdat->msize,
      iVar7 < (int)mdat->mflags1)))) {
    *(uint *)&mdat[1].mname = *(uint *)&mdat[1].mname & 0xdfffffff;
  }
  quest_stat_check((monst *)mdat);
  if ((((uint)mdat[1].mattk[4] >> 0x12 & 1) == 0) || (((ulong)mdat[1].mname & 0x30000000) != 0)) {
    if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
       ((u.umonnum == u.umonster || (bVar5 = dmgtype(youmonst.data,0x24), bVar5 == '\0')))) {
      newsym((int)*(char *)((long)&mdat[1].geno + 1),(int)(char)mdat[1].mattk[0].aatyp);
    }
    if ((((((uint)mdat[1].mattk[4] >> 0x12 & 1) != 0) && (((ulong)mdat[1].mname & 0x10000000) != 0))
        && (((uint)mdat[1].mattk[4] >> 0x13 & 1) == 0)) &&
       (bVar5 = monnear((monst *)mdat,(int)u.ux,(int)u.uy), bVar5 != '\0')) {
      quest_talk((monst *)mdat);
    }
    return 0;
  }
  if ((((uint)mdat[1].mattk[4] >> 0x13 & 1) != 0) && (iVar7 = disturb((monst *)mdat), iVar7 == 0)) {
    if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
       ((u.umonnum == u.umonster || (bVar5 = dmgtype(youmonst.data,0x24), bVar5 == '\0')))) {
      newsym((int)*(char *)((long)&mdat[1].geno + 1),(int)(char)mdat[1].mattk[0].aatyp);
    }
    return 0;
  }
  wipe_engr_at(*(level **)mdat->mattk,*(xchar *)((long)&mdat[1].geno + 1),mdat[1].mattk[0].aatyp,
               '\x01');
  if ((((uint)mdat[1].mattk[4] >> 0x15 & 1) != 0) && (iVar7 = rn2(0x32), iVar7 == 0)) {
    mdat[1].mattk[4] = (attack)((uint)mdat[1].mattk[4] & 0xffdfffff);
  }
  if ((((uint)mdat[1].mattk[4] >> 0x14 & 1) != 0) && (iVar7 = rn2(10), iVar7 == 0)) {
    mdat[1].mattk[4] = (attack)((uint)mdat[1].mattk[4] & 0xffefffff);
  }
  if ((((((uint)mdat[1].mattk[4] >> 0x10 & 1) != 0) && (iVar7 = rn2(0x28), iVar7 == 0)) &&
      ((_inrange->mflags1 & 0x2000000) != 0)) &&
     ((((uint)mdat[1].mattk[4] >> 0x1d & 1) == 0 &&
      ((*(uint *)&(level->flags).field_0x8 >> 0xb & 1) == 0)))) {
    rloc(level,(monst *)mdat,'\0');
    return 0;
  }
  if ((_inrange->msound == '\x0f') &&
     (bVar5 = um_dist(*(xchar *)((long)&mdat[1].geno + 1),mdat[1].mattk[0].aatyp,'\x01'),
     bVar5 == '\0')) {
    m_respond((monst *)mdat);
  }
  if ((_inrange == mons + 0x127) &&
     ((viz_array[(char)mdat[1].mattk[0].aatyp][*(char *)((long)&mdat[1].geno + 1)] & 1U) != 0)) {
    m_respond((monst *)mdat);
  }
  iVar1._0_2_ = mdat->pxtyp;
  iVar1._2_1_ = mdat->msound;
  iVar1._3_1_ = mdat->msize;
  if (iVar1 < 1) {
    return 1;
  }
  if ((((((uint)mdat[1].mattk[4] >> 0x10 & 1) != 0) && (mdat[1].mattk[5].aatyp == '\0')) &&
      (uVar2._0_2_ = mdat->pxtyp, uVar2._2_1_ = mdat->msound, uVar2._3_1_ = mdat->msize,
      uVar2 == mdat->mflags1)) && (iVar7 = rn2(0x19), iVar7 == 0)) {
    mdat[1].mattk[4] = (attack)((uint)mdat[1].mattk[4] & 0xfffeffff);
  }
  set_apparxy(level,(monst *)mdat);
  if ((_inrange->mflags3 & 0x1f) != 0) {
    tactics((monst *)mdat);
  }
  distfleeck((monst *)mdat,&scared,(int *)((long)&ygold + 4),(int *)&ygold);
  bVar5 = find_defensive((monst *)mdat,(musable *)local_68);
  if (bVar5 == '\0') {
    bVar5 = find_misc((monst *)mdat,(musable *)local_68);
    if ((bVar5 != '\0') && (iVar7 = use_misc((monst *)mdat,(musable *)local_68), iVar7 != 0)) {
      return 1;
    }
  }
  else {
    iVar7 = use_defensive((monst *)mdat,(musable *)local_68);
    if (iVar7 != 0) {
      return 1;
    }
  }
  if (((ygold._4_4_ != 0) && (_inrange->msound == '\x1c')) &&
     ((iVar7 = monsndx(_inrange), iVar7 != 0x10d &&
      (((((uint)mdat[1].mattk[4] >> 0x16 & 1) != 0 && (mdat[1].mattk[2].aatyp == '\0')) &&
       ((u._1052_1_ & 1) == 0)))))) {
    if ((mdat[1].mattk[0].adtyp == u.ux) && (mdat[1].mattk[0].damn == u.uy)) {
      iVar7 = demon_talk((monst *)mdat);
      if (iVar7 != 0) {
        return 1;
      }
    }
    else {
      if ((viz_array[(char)mdat[1].mattk[0].damn][(char)mdat[1].mattk[0].adtyp] & 2U) == 0) {
        local_b0 = "It";
      }
      else {
        local_b0 = Monnam((monst *)mdat);
      }
      pline("%s whispers at thin air.",local_b0);
      if (((youmonst.data)->mflags2 & 0x200) == 0) {
        mdat[1].mattk[4] = (attack)((uint)mdat[1].mattk[4] & 0xfffffff7);
        mdat[1].mattk[4] = (attack)((uint)mdat[1].mattk[4] & 0xfffffffd);
        pcVar9 = Amonnam((monst *)mdat);
        pline("%s gets angry!",pcVar9);
        mdat[1].mattk[4] = (attack)((uint)mdat[1].mattk[4] & 0xffbfffff);
      }
      else {
        bVar5 = tele_restrict((monst *)mdat);
        if (bVar5 == '\0') {
          rloc(level,(monst *)mdat,'\0');
        }
      }
    }
  }
  if (((ygold._4_4_ != 0) && (iVar7 = monsndx(_inrange), iVar7 == 0x10d)) &&
     ((((uint)mdat[1].mattk[4] >> 0x16 & 1) == 0 &&
      (((mdat[1].mattk[2].aatyp == '\0' && ((u._1052_1_ & 1) == 0)) && (mdat->mflags2 == 0)))))) {
    lVar8 = (long)(u.ulevel * 500);
    pcVar9 = Amonnam((monst *)mdat);
    currency(lVar8);
    pline("%s demands %ld %s to avoid re-arrest.",pcVar9,lVar8);
    lVar10 = bribe((monst *)mdat);
    if (lVar10 < lVar8) {
      verbalize("I said %ld!",lVar8);
      mdat->mflags2 = 1000;
    }
    else {
      verbalize("Good.  Now beat it, scum!");
      mdat[1].mattk[4] = (attack)((uint)mdat[1].mattk[4] & 0xffbfffff | 0x400000);
      set_malign((monst *)mdat);
    }
  }
  if ((_inrange == mons + 0x125) || (_inrange == mons + 0x126)) {
    watch_on_duty((monst *)mdat);
    goto LAB_0025438b;
  }
  if ((((_inrange != mons + 0x31) && (_inrange != mons + 0x32)) && (_inrange != mons + 0x143)) ||
     (iVar7 = rn2(0x14), iVar7 != 0)) goto LAB_0025438b;
  if (mdat[1].mattk[5].adtyp == '\0') {
    if ((viz_array[(char)mdat[1].mattk[0].aatyp][*(char *)((long)&mdat[1].geno + 1)] & 2U) != 0)
    goto LAB_00253bc1;
    if (((((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
        ((u.uprops[0x40].intrinsic != 0 ||
         ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))))) &&
       ((*(ushort *)(*(long *)&mdat->mlet + 0x38) & 0x200) != 0)) {
      bVar6 = viz_array[(char)mdat[1].mattk[0].aatyp][*(char *)((long)&mdat[1].geno + 1)] & 1;
      goto joined_r0x00253bbb;
    }
  }
  else {
    bVar6 = worm_known(level,(monst *)mdat);
joined_r0x00253bbb:
    if (bVar6 != 0) {
LAB_00253bc1:
      if ((((((((uint)mdat[1].mattk[4] >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
            (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
          ((((uint)mdat[1].mattk[4] >> 7 & 1) == 0 && (((uint)mdat[1].mattk[4] >> 9 & 1) == 0)))) &&
         (((byte)u._1052_1_ >> 5 & 1) == 0)) {
        pcVar9 = Monnam((monst *)mdat);
        pline("%s concentrates.",pcVar9);
      }
    }
  }
  if (u.uprops[0x19].blocked == 0) {
    iVar7 = dist2((int)*(char *)((long)&mdat[1].geno + 1),(int)(char)mdat[1].mattk[0].aatyp,
                  (int)u.ux,(int)u.uy);
    if (iVar7 < 0x41) {
      pline("A wave of psychic energy pours over you!");
      if ((((uint)mdat[1].mattk[4] >> 0x16 & 1) == 0) ||
         (((u.uprops[0x15].intrinsic != 0 || (u.uprops[0x15].extrinsic != 0)) &&
          (iVar7 = resist((monst *)mdat,'\x04',0,0), iVar7 == 0)))) {
        if (((*(uint *)(*(long *)&mdat->mlet + 0x30) & 0x10000) == 0) &&
           ((poVar11 = which_armor((monst *)mdat,4), poVar11 == (obj *)0x0 ||
            (poVar11 = which_armor((monst *)mdat,4), poVar11->otyp != 0x4f)))) {
          if ((((u.uprops[0x1e].intrinsic == 0) &&
               (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
              (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
               (((u.uprops[0x19].intrinsic == 0 &&
                 ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
                ((youmonst.data != mons + 0x31 && (youmonst.data != mons + 0x32)))))))) ||
             (bVar12 = true, u.uprops[0x19].blocked != 0)) {
            if ((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) {
              iVar7 = dist2((int)*(char *)((long)&mdat[1].geno + 1),
                            (int)(char)mdat[1].mattk[0].aatyp,(int)u.ux,(int)u.uy);
              bVar12 = true;
              if (iVar7 < 0x41) goto LAB_00253f3e;
            }
            goto LAB_00253ef6;
          }
        }
        else {
LAB_00253ef6:
          bVar12 = true;
          if ((u.uprops[0x42].intrinsic == 0) && (bVar12 = true, u.uprops[0x42].extrinsic == 0)) {
            bVar5 = match_warn_of_mon((monst *)mdat);
            bVar12 = bVar5 != '\0';
          }
        }
LAB_00253f3e:
        if ((bVar12) ||
           ((((((u.uprops[0x19].intrinsic != 0 || (u.uprops[0x19].extrinsic != 0)) ||
               (youmonst.data == mons + 0x1e)) ||
              ((youmonst.data == mons + 0x31 || (youmonst.data == mons + 0x32)))) &&
             ((u.uprops[0x19].blocked == 0 && (iVar7 = rn2(2), iVar7 != 0)))) ||
            (iVar7 = rn2(10), iVar7 == 0)))) {
          if (bVar12) {
            local_d0 = "telepathy";
          }
          else {
            if (((u.uprops[0x19].intrinsic != 0) || (u.uprops[0x19].extrinsic != 0)) ||
               ((youmonst.data == mons + 0x1e ||
                ((youmonst.data == mons + 0x31 || (bVar12 = false, youmonst.data == mons + 0x32)))))
               ) {
              bVar12 = u.uprops[0x19].blocked == 0;
            }
            local_d0 = "mind";
            if (bVar12) {
              local_d0 = "latent telepathy";
            }
          }
          pline("It locks on to your %s!",local_d0);
          if (_inrange == mons + 0x143) {
            local_d8 = rn2(10);
            local_d8 = local_d8 + 10;
          }
          else {
            local_d8 = rn2(4);
            local_d8 = local_d8 + 4;
          }
          mw_tmp._0_4_ = local_d8;
          if ((u.uprops[0x32].intrinsic != 0) || (u.uprops[0x32].extrinsic != 0)) {
            mw_tmp._0_4_ = (local_d8 + 1) / 2;
          }
          losehp((int)mw_tmp,"psychic blast",0);
        }
      }
      else {
        pline("It feels quite soothing.");
      }
    }
    else {
      pline("You sense a faint wave of psychic energy.");
    }
  }
  else if (uarmh != (obj *)0x0) {
    pcVar9 = yname(uarmh);
    pline("You sense something being blocked by %s.",pcVar9);
  }
  pmVar4 = level->monlist;
  while (nmon = pmVar4, nmon != (monst *)0x0) {
    pmVar4 = nmon->nmon;
    if ((((((0 < nmon->mhp) &&
           ((*(uint *)&nmon->field_0x60 >> 0x16 & 1) != ((uint)mdat[1].mattk[4] >> 0x16 & 1))) &&
          ((nmon->data->mflags1 & 0x10000) == 0)) &&
         ((nmon != (monst *)mdat &&
          (iVar7 = dist2((int)*(char *)((long)&mdat[1].geno + 1),(int)(char)mdat[1].mattk[0].aatyp,
                         (int)nmon->mx,(int)nmon->my), iVar7 < 0x41)))) &&
        ((poVar11 = which_armor(nmon,4), poVar11 == (obj *)0x0 ||
         (poVar11 = which_armor(nmon,4), poVar11->otyp != 0x4f)))) &&
       (((((nmon->data == mons + 0x1e || (nmon->data == mons + 0x31)) || (nmon->data == mons + 0x32)
          ) && ((iVar7 = rn2(2), iVar7 != 0 || (nmon->mblinded != '\0')))) ||
        (iVar7 = rn2(10), iVar7 == 0)))) {
      if ((viz_array[nmon->my][nmon->mx] & 2U) != 0) {
        pcVar9 = mon_nam(nmon);
        pline("It locks on to %s.",pcVar9);
      }
      iVar7 = rnd(0xf);
      nmon->mhp = nmon->mhp - iVar7;
      if (nmon->mhp < 1) {
        monkilled(nmon,"",0x20);
      }
      else {
        *(uint *)&nmon->field_0x60 = *(uint *)&nmon->field_0x60 & 0xfff7ffff;
      }
    }
  }
LAB_0025438b:
  if (((((((((uint)mdat[1].mattk[4] >> 0x16 & 1) == 0) || (u.uprops[0x15].intrinsic != 0)) ||
         (u.uprops[0x15].extrinsic != 0)) &&
        ((scared != 0 &&
         (iVar7 = dist2((int)*(char *)((long)&mdat[1].geno + 1),(int)(char)mdat[1].mattk[0].aatyp,
                        (int)(char)mdat[1].mattk[0].adtyp,(int)(char)mdat[1].mattk[0].damn),
         iVar7 < 9)))) && (bVar5 = attacktype(_inrange,0xfe), bVar5 != '\0')) &&
      ((((lVar8 = *(long *)(mdat->mattk + 4), (int)ygold == 0 || (lVar8 == 0)) ||
        ((*(char *)(lVar8 + 0x35) != '\x02' && (*(char *)(lVar8 + 0x35) != '\x06')))) ||
       (objects[*(short *)(lVar8 + 0x2a)].oc_subtyp != '\x04')))) &&
     ((mdat[1].mattk[5].damn == '\x01' &&
      (((((uint)mdat[1].mattk[4] >> 0x17 & 1) == 0 || (ygold._4_4_ != 0)) ||
       (poVar11 = select_rwep((monst *)mdat), poVar11 == (obj *)0x0)))))) {
    mdat[1].mattk[5].damn = '\x03';
    iVar7 = mon_wield_item((monst *)mdat);
    if (iVar7 != 0) {
      return 0;
    }
  }
  if (_inrange->mlet == '\f') {
    lepgold = findgold(invent);
    musable._32_8_ = findgold(*(obj **)(mdat->mattk + 2));
  }
  if (((((((ygold._4_4_ == 0) || (((uint)mdat[1].mattk[4] >> 0x10 & 1) != 0)) ||
         (((int)ygold != 0 ||
          ((((uint)mdat[1].mattk[4] >> 0x15 & 1) != 0 || (((uint)mdat[1].mattk[4] >> 0x14 & 1) != 0)
           ))))) ||
        (((((uint)mdat[1].mattk[4] >> 1 & 1) != 0 && (iVar7 = rn2(3), iVar7 == 0)) ||
         (((_inrange->mlet == '\f' && (lepgold == (obj *)0x0)) &&
          ((musable._32_8_ != 0 || (iVar7 = rn2(2), iVar7 != 0)))))))) ||
       (((_inrange->mflags2 & 0x800000) != 0 && (iVar7 = rn2(4), iVar7 == 0)))) ||
      (((u.uprops[0x15].intrinsic != 0 || (u.uprops[0x15].extrinsic != 0)) &&
       ((((uint)mdat[1].mattk[4] >> 0x1d & 1) == 0 &&
        (bVar5 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level), bVar5 == '\0')))))) ||
     (((((uint)mdat[1].mattk[4] >> 0x11 & 1) == 0 && (iVar7 = rn2(4), iVar7 == 0)) ||
      (((uint)mdat[1].mattk[4] >> 0x16 & 1) != 0)))) {
    iVar7 = dist2((int)*(char *)((long)&mdat[1].geno + 1),(int)(char)mdat[1].mattk[0].aatyp,
                  (int)u.ux,(int)u.uy);
    if ((iVar7 < 0x32) && (mdat->mflags2 == 0)) {
      local_a8 = _inrange->mattk;
      while ((local_a8 < &_inrange->cwt &&
             ((local_a8->aatyp != 0xff ||
              (((local_a8->adtyp != 0xf1 && (local_a8->adtyp != 0xf0)) ||
               (iVar7 = castmu((monst *)mdat,local_a8,'\0','\0'), iVar7 == 0))))))) {
        local_a8 = local_a8 + 1;
      }
    }
    nearby = m_move((monst *)mdat,0);
    distfleeck((monst *)mdat,&scared,(int *)((long)&ygold + 4),(int *)&ygold);
    switch(nearby) {
    case 0:
    case 3:
      if ((((uint)mdat[1].mattk[4] >> 0x1b & 1) != 0) &&
         ((iVar3._0_2_ = mdat->pxtyp, iVar3._2_1_ = mdat->msound, iVar3._3_1_ = mdat->msize,
          iVar3 < 1 ||
          ((*(char *)((long)&mdat[1].geno + 1) == '\0' && (mdat[1].mattk[0].aatyp == '\0')))))) {
        return 1;
      }
      if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
         ((u.umonnum == u.umonster || (bVar5 = dmgtype(youmonst.data,0x24), bVar5 == '\0')))) {
        newsym((int)*(char *)((long)&mdat[1].geno + 1),(int)(char)mdat[1].mattk[0].aatyp);
      }
      break;
    case 1:
      if ((((uint)mdat[1].mattk[4] >> 0x13 & 1) != 0) || (((uint)mdat[1].mattk[4] >> 0x12 & 1) == 0)
         ) {
        return 0;
      }
      if ((ygold._4_4_ != 0) ||
         ((bVar5 = ranged_attk(_inrange), bVar5 == '\0' &&
          (bVar5 = find_offensive((monst *)mdat,(musable *)local_68), bVar5 == '\0')))) {
        if (((u._1052_1_ & 1) != 0) && ((monst *)mdat == u.ustuck)) {
          iVar7 = mattacku((monst *)mdat);
          return iVar7;
        }
        return 0;
      }
      break;
    case 2:
      return 1;
    }
  }
  if ((((uint)mdat[1].mattk[4] >> 0x16 & 1) == 0) ||
     ((((u.uprops[0x15].intrinsic != 0 || (u.uprops[0x15].extrinsic != 0)) &&
       (iVar7 = resist((monst *)mdat,'\x04',0,0), iVar7 == 0)) &&
      (bVar5 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level), bVar5 == '\0')))) {
    if (((scared != 0) && (iVar7 = noattacks(_inrange), iVar7 == 0)) &&
       ((0 < u.uhp &&
        ((((int)ygold == 0 && (nearby != 3)) && (iVar7 = mattacku((monst *)mdat), iVar7 != 0)))))) {
      return 1;
    }
    if (mdat[1].mattk[5].adtyp != '\0') {
      wormhitu((monst *)mdat);
    }
  }
  if (((((uint)mdat[1].mattk[4] >> 0x13 & 1) == 0) && (((uint)mdat[1].mattk[4] >> 0x12 & 1) != 0))
     && (ygold._4_4_ != 0)) {
    quest_talk((monst *)mdat);
  }
  if (((scared != 0) && (*(char *)(*(long *)&mdat->mlet + 0x2e) == '\x1d')) &&
     (((((uint)mdat[1].mattk[4] >> 0x16 & 1) == 0 &&
       (((viz_array[(char)mdat[1].mattk[0].aatyp][*(char *)((long)&mdat[1].geno + 1)] & 1U) != 0 &&
        (((uint)mdat[1].mattk[4] >> 1 & 1) == 0)))) && (iVar7 = rn2(5), iVar7 == 0)))) {
    cuss((monst *)mdat);
  }
  return (uint)(nearby == 2);
}

Assistant:

int dochug(struct monst *mtmp)
{
	const struct permonst *mdat;
	int tmp=0;
	int inrange, nearby, scared;
        struct obj *ygold = 0, *lepgold = 0;
	struct musable musable;

/*	Pre-movement adjustments	*/

	mdat = mtmp->data;

	if (mtmp->mstrategy & STRAT_ARRIVE) {
	    int res = m_arrival(mtmp);
	    if (res >= 0) return res;
	}

	/* check for waitmask status change */
	if ((mtmp->mstrategy & STRAT_WAITFORU) &&
		(m_canseeu(mtmp) || mtmp->mhp < mtmp->mhpmax))
	    mtmp->mstrategy &= ~STRAT_WAITFORU;

	/* update quest status flags */
	quest_stat_check(mtmp);

	if (!mtmp->mcanmove || (mtmp->mstrategy & STRAT_WAITMASK)) {
	    if (Hallucination) newsym(mtmp->mx,mtmp->my);
	    if (mtmp->mcanmove && (mtmp->mstrategy & STRAT_CLOSE) &&
	       !mtmp->msleeping && monnear(mtmp, u.ux, u.uy))
		quest_talk(mtmp);	/* give the leaders a chance to speak */
	    return 0;	/* other frozen monsters can't do anything */
	}

	/* there is a chance we will wake it */
	if (mtmp->msleeping && !disturb(mtmp)) {
		if (Hallucination) newsym(mtmp->mx,mtmp->my);
		return 0;
	}

	/* not frozen or sleeping: wipe out texts written in the dust */
	wipe_engr_at(mtmp->dlevel, mtmp->mx, mtmp->my, 1);

	/* confused monsters get unconfused with small probability */
	if (mtmp->mconf && !rn2(50)) mtmp->mconf = 0;

	/* stunned monsters get un-stunned with larger probability */
	if (mtmp->mstun && !rn2(10)) mtmp->mstun = 0;

	/* some monsters teleport */
	if (mtmp->mflee && !rn2(40) && can_teleport(mdat) && !mtmp->iswiz &&
	    !level->flags.noteleport) {
		rloc(level, mtmp, FALSE);
		return 0;
	}
	if (mdat->msound == MS_SHRIEK && !um_dist(mtmp->mx, mtmp->my, 1))
	    m_respond(mtmp);
	if (mdat == &mons[PM_MEDUSA] && couldsee(mtmp->mx, mtmp->my))
	    m_respond(mtmp);
	if (mtmp->mhp <= 0) return 1; /* m_respond gaze can kill medusa */

	/* fleeing monsters might regain courage */
	if (mtmp->mflee && !mtmp->mfleetim
	   && mtmp->mhp == mtmp->mhpmax && !rn2(25)) mtmp->mflee = 0;

	set_apparxy(level, mtmp);
	/* Must be done after you move and before the monster does.  The
	 * set_apparxy() call in m_move() doesn't suffice since the variables
	 * inrange, etc. all depend on stuff set by set_apparxy().
	 */

	/* Monsters that want to acquire things */
	/* may teleport, so do it before inrange is set */
	if (is_covetous(mdat)) tactics(mtmp);

	/* check distance and scariness of attacks */
	distfleeck(mtmp,&inrange,&nearby,&scared);

	if (find_defensive(mtmp, &musable)) {
		if (use_defensive(mtmp, &musable) != 0)
			return 1;
	} else if (find_misc(mtmp, &musable)) {
		if (use_misc(mtmp, &musable) != 0)
			return 1;
	}

	/* Demonic Blackmail! */
	if (nearby && mdat->msound == MS_BRIBE &&
	    monsndx(mdat) != PM_PRISON_GUARD &&
	    mtmp->mpeaceful && !mtmp->mtame && !u.uswallow) {
		if (mtmp->mux != u.ux || mtmp->muy != u.uy) {
			pline("%s whispers at thin air.",
			    cansee(mtmp->mux, mtmp->muy) ? Monnam(mtmp) : "It");

			if (is_demon(youmonst.data)) {
			  /* "Good hunting, brother" */
			    if (!tele_restrict(mtmp)) rloc(level, mtmp, FALSE);
			} else {
			    mtmp->minvis = mtmp->perminvis = 0;
			    /* Why?  For the same reason in real demon talk */
			    pline("%s gets angry!", Amonnam(mtmp));
			    mtmp->mpeaceful = 0;
			    /* since no way is an image going to pay it off */
			}
		} else if (demon_talk(mtmp)) return 1;	/* you paid it off */
	}

	/* Prison guard extortion */
	if (nearby && monsndx(mdat) == PM_PRISON_GUARD &&
	    !mtmp->mpeaceful && !mtmp->mtame && !u.uswallow && !mtmp->mspec_used) {
	    long gdemand = 500 * u.ulevel;
	    long goffer = 0;

	    pline("%s demands %ld %s to avoid re-arrest.",
		  Amonnam(mtmp), gdemand, currency(gdemand));
	    if ((goffer = bribe(mtmp)) >= gdemand) {
		verbalize("Good.  Now beat it, scum!");
		mtmp->mpeaceful = 1;
		set_malign(mtmp);
	    } else {
		verbalize("I said %ld!", gdemand);
		mtmp->mspec_used = 1000;
	    }
	}

	/* the watch will look around and see if you are up to no good :-) */
	if (mdat == &mons[PM_WATCHMAN] || mdat == &mons[PM_WATCH_CAPTAIN])
		watch_on_duty(mtmp);

	/* [DS] Cthulhu also uses psychic blasts. */
	else if ((is_mind_flayer(mdat) || mdat == &mons[PM_CTHULHU]) && !rn2(20)) {
		struct monst *m2, *nmon = NULL;

		if (canseemon(level, mtmp))
			pline("%s concentrates.", Monnam(mtmp));

		if (BTelepat) {
			if (uarmh)
				pline("You sense something being blocked by %s.",
				      yname(uarmh));
			goto toofar;
		}
		if (distu(mtmp->mx, mtmp->my) > BOLT_LIM * BOLT_LIM) {
			pline("You sense a faint wave of psychic energy.");
			goto toofar;
		}
		pline("A wave of psychic energy pours over you!");
		if (mtmp->mpeaceful &&
		    (!Conflict || resist(mtmp, RING_CLASS, 0, 0)))
			pline("It feels quite soothing.");
		else {
			boolean m_sen = sensemon(mtmp);

			if (m_sen || (Blind_telepat && rn2(2)) || !rn2(10)) {
				int dmg;
				pline("It locks on to your %s!",
					m_sen ? "telepathy" :
					Blind_telepat ? "latent telepathy" : "mind");
				dmg = (mdat == &mons[PM_CTHULHU]) ?
					rn1(10, 10) :
					rn1(4, 4);
				if (Half_spell_damage) dmg = (dmg+1) / 2;
				losehp(dmg, "psychic blast", KILLED_BY_AN);
			}
		}
toofar:
		for (m2=level->monlist; m2; m2 = nmon) {
			nmon = m2->nmon;
			if (DEADMONSTER(m2)) continue;
			if (m2->mpeaceful == mtmp->mpeaceful) continue;
			if (mindless(m2->data)) continue;
			if (m2 == mtmp) continue;
			if (dist2(mtmp->mx, mtmp->my, m2->mx, m2->my) >
			    BOLT_LIM * BOLT_LIM)
				continue;
			if (which_armor(m2, W_ARMH) &&
			    which_armor(m2, W_ARMH)->otyp == TINFOIL_HAT)
				continue;
			if ((telepathic(m2->data) &&
			    (rn2(2) || m2->mblinded)) || !rn2(10)) {
				if (cansee(m2->mx, m2->my))
				    pline("It locks on to %s.", mon_nam(m2));
				m2->mhp -= rnd(15);
				if (m2->mhp <= 0)
				    monkilled(m2, "", AD_DRIN);
				else
				    m2->msleeping = 0;
			}
		}
	}

	/* If monster is nearby you, and has to wield a weapon, do so.   This
	 * costs the monster a move, of course.
	 */
	if ((!mtmp->mpeaceful || Conflict) && inrange &&
	   dist2(mtmp->mx, mtmp->my, mtmp->mux, mtmp->muy) <= 8
	   && attacktype(mdat, AT_WEAP)) {
	    struct obj *mw_tmp;

	    /* The scared check is necessary.  Otherwise a monster that is
	     * one square near the player but fleeing into a wall would keep	
	     * switching between pick-axe and weapon.  If monster is stuck
	     * in a trap, prefer ranged weapon (wielding is done in thrwmu).
	     * This may cost the monster an attack, but keeps the monster
	     * from switching back and forth if carrying both.
	     */
	    mw_tmp = MON_WEP(mtmp);
	    if (!(scared && mw_tmp && is_pick(mw_tmp)) &&
		mtmp->weapon_check == NEED_WEAPON &&
		!(mtmp->mtrapped && !nearby && select_rwep(mtmp))) {
		mtmp->weapon_check = NEED_HTH_WEAPON;
		if (mon_wield_item(mtmp) != 0) return 0;
	    }
	}

/*	Now the actual movement phase	*/

        if (mdat->mlet == S_LEPRECHAUN) {
	    ygold = findgold(invent);
	    lepgold = findgold(mtmp->minvent);
	}

	if (!nearby || mtmp->mflee || scared ||
	   mtmp->mconf || mtmp->mstun || (mtmp->minvis && !rn2(3)) ||
	   (mdat->mlet == S_LEPRECHAUN && !ygold && (lepgold || rn2(2))) ||
	   (is_wanderer(mdat) && !rn2(4)) ||
	   (Conflict && !mtmp->iswiz && !Is_blackmarket(&u.uz)) ||
	   (!mtmp->mcansee && !rn2(4)) || mtmp->mpeaceful) {
		/* Possibly cast an undirected spell if not attacking you */
		/* note that most of the time castmu() will pick a directed
		   spell and do nothing, so the monster moves normally */
		/* arbitrary distance restriction to keep monster far away
		   from you from having cast dozens of sticks-to-snakes
		   or similar spells by the time you reach it */
		if (dist2(mtmp->mx, mtmp->my, u.ux, u.uy) <= 49 && !mtmp->mspec_used) {
		    const struct attack *a;

		    for (a = &mdat->mattk[0]; a < &mdat->mattk[NATTK]; a++) {
			if (a->aatyp == AT_MAGC && (a->adtyp == AD_SPEL || a->adtyp == AD_CLRC)) {
			    if (castmu(mtmp, a, FALSE, FALSE)) {
				break;
			    }
			}
		    }
		}

		tmp = m_move(mtmp, 0);
		distfleeck(mtmp,&inrange,&nearby,&scared);	/* recalc */

		switch (tmp) {
		    case 0:	/* no movement, but it can still attack you */
		    case 3:	/* absolutely no movement */
				/* for pets, case 0 and 3 are equivalent */
			/* vault guard might have vanished */
			if (mtmp->isgd && (mtmp->mhp < 1 ||
					    (mtmp->mx == 0 && mtmp->my == 0)))
			    return 1;	/* behave as if it died */
			/* During hallucination, monster appearance should
			 * still change - even if it doesn't move.
			 */
			if (Hallucination) newsym(mtmp->mx,mtmp->my);
			break;
		    case 1:	/* monster moved */
			/* Maybe it stepped on a trap and fell asleep... */
			if (mtmp->msleeping || !mtmp->mcanmove) return 0;
			if (!nearby &&
			  (ranged_attk(mdat) || find_offensive(mtmp, &musable)))
			    break;
 			else if (u.uswallow && mtmp == u.ustuck) {
			    /* a monster that's digesting you can move at the
			     * same time -dlc
			     */
			    return mattacku(mtmp);
			} else
				return 0;
			/*NOTREACHED*/
			break;
		    case 2:	/* monster died */
			return 1;
		}
	}

/*	Now, attack the player if possible - one attack set per monst	*/

	if (!mtmp->mpeaceful ||
	    (Conflict && !resist(mtmp, RING_CLASS, 0, 0) &&
	     !Is_blackmarket(&u.uz))) {
	    if (inrange && !noattacks(mdat) && u.uhp > 0 && !scared && tmp != 3)
		if (mattacku(mtmp)) return 1; /* monster died (e.g. exploded) */

	    if (mtmp->wormno) wormhitu(mtmp);
	}
	/* special speeches for quest monsters */
	if (!mtmp->msleeping && mtmp->mcanmove && nearby)
	    quest_talk(mtmp);
	/* extra emotional attack for vile monsters */
	if (inrange && mtmp->data->msound == MS_CUSS && !mtmp->mpeaceful &&
		couldsee(mtmp->mx, mtmp->my) && !mtmp->minvis && !rn2(5))
	    cuss(mtmp);

	return tmp == 2;
}